

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::create_color_selector_codebook(dxt_hc *this)

{
  vector<unsigned_int> *this_00;
  vector<bool> *this_01;
  float *pfVar1;
  elemental_vector *this_02;
  int *piVar2;
  unsigned_long_long *puVar3;
  uint *puVar4;
  task_pool *this_03;
  uint64 uVar5;
  bool *pbVar6;
  uint *puVar7;
  undefined8 uVar8;
  int iVar9;
  vec<16U,_float> *pvVar10;
  executable_task *pObj;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint64 uVar17;
  uint64 uVar18;
  uint *puVar19;
  uint uVar20;
  ulong uVar21;
  uint *puVar22;
  unsigned_long_long uVar23;
  uint64 uVar24;
  ulong uVar25;
  undefined1 uVar26;
  uint64 uVar27;
  void *pvVar28;
  long lVar29;
  ulong uVar30;
  uint64 *puVar31;
  uint t;
  uint8 p;
  void *pvVar32;
  uint8 s;
  uint64 uVar33;
  ulong uVar34;
  long lVar35;
  bool bVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vector<crnlib::vector<crnlib::color_selector_details>_> selector_details;
  vector<unsigned_int> weights;
  vector<crnlib::SelectorNode> nodes;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<unsigned_long_long> selectors;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  float v [4];
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  undefined1 local_188 [16];
  vector<unsigned_int> local_178;
  elemental_vector local_168;
  vector<crnlib::vec<16U,_float>_> local_158;
  elemental_vector local_148;
  vector<unsigned_int> *local_130;
  ulong local_128;
  ulong local_120;
  undefined1 local_118 [16];
  pointer local_108;
  vector<bool> *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [144];
  undefined1 local_48 [16];
  ulong local_38;
  
  bVar11 = this->m_has_subblocks;
  uVar15 = this->m_num_blocks;
  uVar14 = uVar15 >> (bVar11 & 0x1f);
  uVar13 = this->m_pTask_pool->m_num_threads;
  local_148.m_p = (void *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  if (uVar14 != 0) {
    elemental_vector::increase_capacity(&local_148,uVar14,uVar14 == 1,8,(object_mover)0x0,false);
    memset((void *)((ulong)local_148.m_size * 8 + (long)local_148.m_p),0,
           (ulong)(uVar14 - local_148.m_size) << 3);
    local_148.m_size = uVar14;
    bVar11 = this->m_has_subblocks;
    uVar15 = this->m_num_blocks;
  }
  uVar14 = uVar13 + 1;
  if (uVar15 != 0) {
    puVar3 = this->m_block_selectors[0].m_p;
    uVar16 = 0;
    uVar30 = 0;
    do {
      if ((bVar11 & 1) == 0) {
        uVar23 = 0;
      }
      else {
        uVar23 = puVar3[(int)uVar30 + 1];
      }
      uVar25 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
      *(unsigned_long_long *)((long)local_148.m_p + uVar25 * 8) = uVar23 + puVar3[uVar30];
      uVar20 = (int)uVar30 + (bVar11 & 1) + 1;
      uVar30 = (ulong)uVar20;
    } while (uVar20 < uVar15);
  }
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  local_128 = (ulong)uVar13;
  if (uVar14 != 0) {
    uVar15 = 0;
    iVar12 = 1;
    pvVar32 = local_148.m_p;
    do {
      pvVar28 = (void *)(((ulong)(local_148.m_size * iVar12) / (ulong)uVar14) * 8 +
                        (long)local_148.m_p);
      if (pvVar32 != pvVar28) {
        if (local_168.m_capacity <= uVar15) {
          elemental_vector::increase_capacity
                    (&local_168,uVar15 + 1,true,0x10,vector<crnlib::SelectorNode>::object_mover,
                     false);
          uVar15 = local_168.m_size;
        }
        *(void **)((long)local_168.m_p + (ulong)uVar15 * 0x10) = pvVar32;
        *(void **)((long)local_168.m_p + (ulong)uVar15 * 0x10 + 8) = pvVar28;
        uVar15 = uVar15 + 1;
        local_168.m_size = uVar15;
      }
      iVar9 = (1 - uVar13) + iVar12;
      iVar12 = iVar12 + 1;
      pvVar32 = pvVar28;
    } while (iVar9 != 2);
    if (uVar15 != 0) {
      lVar29 = 0;
      uVar33 = 0;
      do {
        task_pool::queue_task
                  (this->m_pTask_pool,SelectorNode::sort_task,uVar33,
                   (void *)((long)local_168.m_p + lVar29));
        uVar33 = uVar33 + 1;
        lVar29 = lVar29 + 0x10;
      } while (uVar33 < local_168.m_size);
    }
  }
  task_pool::join(this->m_pTask_pool);
  local_118 = (undefined1  [16])0x0;
  local_108 = (pointer)0x0;
  if (local_168.m_size != 0) {
    lVar29 = 0;
    uVar30 = 0;
    do {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
              *)local_118,(value_type *)((long)local_168.m_p + lVar29));
      uVar30 = uVar30 + 1;
      lVar29 = lVar29 + 0x10;
    } while (uVar30 < local_168.m_size);
  }
  local_e8 = 0x3ec000003e000000;
  uStack_e0 = 0x3f6000003f200000;
  local_158.m_p = (vec<16U,_float> *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  local_178.m_p = (uint *)0x0;
  local_178.m_size = 0;
  local_178.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&local_158,local_148.m_size);
  vector<unsigned_int>::reserve(&local_178,local_148.m_size);
  if (local_118._8_8_ != local_118._0_8_) {
    uVar30 = 0;
    do {
      local_188._8_8_ = ((pointer)local_118._0_8_)->pEnd;
      local_188._0_8_ = ((pointer)local_118._0_8_)->p + 1;
      uVar25 = *((pointer)local_118._0_8_)->p;
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::pop((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
             *)local_118);
      if (local_188._0_8_ != local_188._8_8_) {
        std::
        priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
        ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                *)local_118,(value_type *)local_188);
      }
      uVar34 = uVar25 >> 0x20;
      uVar15 = (uint)uVar25;
      if (local_158.m_size == 0 || uVar34 != uVar30) {
        lVar29 = 0xf;
        uVar30 = uVar34;
        do {
          *(undefined4 *)(local_d8 + lVar29 * 4) =
               *(undefined4 *)((long)&local_e8 + (ulong)((uint)uVar30 & 3) * 4);
          uVar30 = uVar30 >> 2;
          bVar36 = lVar29 != 0;
          lVar29 = lVar29 + -1;
        } while (bVar36);
        if (local_158.m_capacity <= local_158.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_158,local_158.m_size + 1,true,0x40,(object_mover)0x0
                     ,false);
        }
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 0xc) = local_d8._48_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 0xc + 2) = local_d8._56_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 8) = local_d8._32_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 8 + 2) = local_d8._40_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 4) = local_d8._16_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 4 + 2) = local_d8._24_8_;
        *(undefined8 *)local_158.m_p[local_158.m_size].m_s = local_d8._0_8_;
        *(undefined8 *)(local_158.m_p[local_158.m_size].m_s + 2) = local_d8._8_8_;
        local_158.m_size = local_158.m_size + 1;
        if (local_178.m_capacity <= local_178.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_178,local_178.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_178.m_p[local_178.m_size] = uVar15;
        local_178.m_size = local_178.m_size + 1;
        uVar30 = uVar34;
      }
      else {
        uVar13 = local_178.m_size - 1;
        if (CARRY4(local_178.m_p[uVar13],uVar15)) {
          local_178.m_p[uVar13] = 0xffffffff;
        }
        else {
          local_178.m_p[uVar13] = local_178.m_p[uVar13] + uVar15;
        }
      }
    } while (local_118._8_8_ != local_118._0_8_);
  }
  local_d8._104_8_ = (raw_node *)0x0;
  local_d8._112_4_ = 0;
  local_d8._116_4_ = 0;
  local_d8._88_8_ = (bool *)0x0;
  local_d8._96_4_ = 0;
  local_d8._100_4_ = 0;
  local_d8._72_8_ = (VectorInfo *)0x0;
  local_d8._80_4_ = 0;
  local_d8._84_4_ = 0;
  local_d8._56_8_ = (VectorInfo *)0x0;
  local_d8._64_4_ = 0;
  local_d8._68_4_ = 0;
  local_d8._40_8_ = (VectorInfo *)0x0;
  local_d8._48_4_ = 0;
  local_d8._52_4_ = 0;
  local_d8._24_8_ = (double *)0x0;
  local_d8._32_4_ = 0;
  local_d8._36_4_ = 0;
  local_d8._8_8_ = (vec<16U,_float> *)0x0;
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0;
  local_d8._120_4_ = 0x20;
  local_d8._128_16_ = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_d8,local_158.m_p,local_178.m_p,
             local_158.m_size,(this->m_params).m_color_selector_codebook_size,false,
             this->m_pTask_pool);
  this_00 = &this->m_color_selectors;
  uVar13 = (uint)local_38;
  uVar15 = (this->m_color_selectors).m_size;
  if (uVar15 != (uint)local_38) {
    if (uVar15 <= (uint)local_38) {
      if ((this->m_color_selectors).m_capacity < (uint)local_38) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,(uint)local_38,uVar15 + 1 == (uint)local_38,4,
                   (object_mover)0x0,false);
        uVar15 = (this->m_color_selectors).m_size;
      }
      memset(this_00->m_p + uVar15,0,(ulong)(uVar13 - uVar15) << 2);
    }
    (this->m_color_selectors).m_size = uVar13;
    uVar13 = (uint)local_38;
  }
  this_01 = &this->m_color_selectors_used;
  uVar15 = (this->m_color_selectors_used).m_size;
  uVar16 = uVar13;
  if (uVar15 != uVar13) {
    if (uVar15 <= uVar13) {
      if ((this->m_color_selectors_used).m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar13,uVar15 + 1 == uVar13,1,(object_mover)0x0,false
                  );
        uVar15 = (this->m_color_selectors_used).m_size;
      }
      memset(this_01->m_p + uVar15,0,(ulong)(uVar13 - uVar15));
      uVar16 = (uint)local_38;
    }
    (this->m_color_selectors_used).m_size = uVar13;
  }
  if (uVar16 != 0) {
    puVar4 = this_00->m_p;
    uVar30 = 0;
    pvVar10 = (vec<16U,_float> *)local_48._8_8_;
    do {
      puVar4[uVar30] = 0;
      uVar15 = 0;
      uVar13 = 0;
      uVar16 = 0;
      uVar20 = 0;
      lVar29 = 0;
      iVar12 = 0;
      iVar9 = 2;
      iVar37 = 4;
      iVar38 = 6;
      do {
        pfVar1 = pvVar10->m_s + lVar29;
        auVar40._0_4_ = (int)(*pfVar1 * 4.0);
        auVar40._4_4_ = (int)(pfVar1[1] * 4.0);
        auVar40._8_4_ = (int)(pfVar1[2] * 4.0);
        auVar40._12_4_ = (int)(pfVar1[3] * 4.0);
        auVar42._0_4_ = auVar40._0_4_ >> 0x1f;
        auVar42._4_4_ = auVar40._4_4_ >> 0x1f;
        auVar42._8_4_ = auVar40._8_4_ >> 0x1f;
        auVar42._12_4_ = auVar40._12_4_ >> 0x1f;
        auVar39._0_4_ = (int)(*pfVar1 * 4.0 - 2.1474836e+09);
        auVar39._4_4_ = (int)(pfVar1[1] * 4.0 - 2.1474836e+09);
        auVar39._8_4_ = (int)(pfVar1[2] * 4.0 - 2.1474836e+09);
        auVar39._12_4_ = (int)(pfVar1[3] * 4.0 - 2.1474836e+09);
        auVar40 = auVar39 & auVar42 | auVar40;
        auVar41._4_4_ = (int)(float)(iVar9 * 0x800000 + 0x3f800000);
        auVar41._12_4_ = (int)(float)(iVar38 * 0x800000 + 0x3f800000);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        uVar15 = uVar15 | auVar40._0_4_ * (int)(float)(iVar12 * 0x800000 + 0x3f800000);
        uVar13 = uVar13 | auVar41._4_4_ * auVar40._4_4_;
        uVar16 = uVar16 | (uint)((auVar40._8_8_ & 0xffffffff) *
                                (ulong)(uint)(int)(float)(iVar37 * 0x800000 + 0x3f800000));
        uVar20 = uVar20 | (uint)((auVar41._8_8_ & 0xffffffff) * (ulong)auVar40._12_4_);
        lVar29 = lVar29 + 4;
        iVar12 = iVar12 + 8;
        iVar9 = iVar9 + 8;
        iVar37 = iVar37 + 8;
        iVar38 = iVar38 + 8;
      } while (lVar29 != 0x10);
      puVar4[uVar30] = uVar20 | uVar13 | uVar16 | uVar15;
      uVar30 = uVar30 + 1;
      pvVar10 = pvVar10 + 1;
    } while (uVar30 < (local_38 & 0xffffffff));
  }
  local_188._0_8_ = (void *)0x0;
  local_188._8_4_ = 0;
  local_188._12_4_ = 0;
  local_120 = (ulong)uVar14;
  local_130 = this_00;
  local_f0 = this_01;
  if (uVar14 != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)local_188,uVar14,(int)local_128 == 0,0x10,(object_mover)0x0,false
              );
    if (uVar14 != local_188._8_4_) {
      memset((uint64 *)(local_188._0_8_ + (ulong)(uint)local_188._8_4_ * 2 * 8),0,
             (ulong)(uVar14 - local_188._8_4_) << 4);
    }
    local_188._8_4_ = uVar14;
    lVar29 = 0;
    uVar33 = 0;
    do {
      this_02 = (elemental_vector *)(local_188._0_8_ + lVar29);
      uVar15 = (this->m_color_selectors).m_size;
      uVar13 = *(uint *)(local_188._0_8_ + lVar29 + 8);
      puVar31 = (uint64 *)local_188._0_8_;
      if (uVar13 != uVar15) {
        if (uVar13 <= uVar15) {
          if (*(uint *)(local_188._0_8_ + lVar29 + 0xc) < uVar15) {
            elemental_vector::increase_capacity
                      (this_02,uVar15,uVar13 + 1 == uVar15,0x104,
                       vector<crnlib::color_selector_details>::object_mover,false);
            uVar13 = this_02->m_size;
          }
          if (uVar15 - uVar13 != 0) {
            memset((void *)((ulong)uVar13 * 0x104 + (long)this_02->m_p),0,
                   (((ulong)(uVar15 - uVar13) * 0x104 - 0x104) / 0x104) * 0x104 + 0x104);
          }
        }
        this_02->m_size = uVar15;
        puVar31 = (uint64 *)local_188._0_8_;
      }
      this_03 = this->m_pTask_pool;
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d29c0;
      pObj[1]._vptr_executable_task = (_func_int **)this;
      pObj[2]._vptr_executable_task = (_func_int **)create_color_selector_codebook_task;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      task_pool::queue_task(this_03,pObj,uVar33,(void *)((long)puVar31 + lVar29));
      uVar33 = uVar33 + 1;
      lVar29 = lVar29 + 0x10;
    } while (local_120 != uVar33);
  }
  task_pool::join(this->m_pTask_pool);
  uVar15 = (this->m_color_selectors).m_size;
  uVar30 = (ulong)uVar15;
  uVar8 = local_188._0_8_;
  if (1 < uVar14) {
    uVar34 = 1;
    uVar25 = uVar30;
    do {
      iVar12 = (int)uVar30;
      uVar30 = 0;
      if (iVar12 != 0) {
        uVar33 = *(uint64 *)(local_188._0_8_ + uVar34 * 2 * 8);
        uVar5 = *(uint64 *)local_188._0_8_;
        uVar21 = 0;
        uVar17 = uVar5;
        uVar18 = uVar33;
        do {
          lVar29 = 0;
          uVar24 = uVar17;
          uVar27 = uVar18;
          do {
            lVar35 = 0;
            do {
              piVar2 = (int *)(uVar24 + lVar35 * 4);
              *piVar2 = *piVar2 + *(int *)(uVar27 + lVar35 * 4);
              lVar35 = lVar35 + 1;
            } while (lVar35 != 4);
            lVar29 = lVar29 + 1;
            uVar27 = uVar27 + 0x10;
            uVar24 = uVar24 + 0x10;
          } while (lVar29 != 0x10);
          lVar29 = uVar21 * 0x104;
          uVar26 = 1;
          if (*(char *)(uVar5 + 0x100 + lVar29) == '\0') {
            uVar26 = *(undefined1 *)(uVar33 + 0x100 + lVar29);
          }
          *(undefined1 *)(lVar29 + uVar5 + 0x100) = uVar26;
          uVar21 = uVar21 + 1;
          uVar30 = (ulong)(this->m_color_selectors).m_size;
          uVar18 = uVar18 + 0x104;
          uVar17 = uVar17 + 0x104;
          uVar25 = uVar30;
        } while (uVar21 < uVar30);
      }
      uVar15 = (uint)uVar25;
      uVar34 = uVar34 + 1;
    } while (uVar34 != local_120);
  }
  if (uVar15 != 0) {
    puVar4 = *(uint **)local_188._0_8_;
    pbVar6 = local_f0->m_p;
    puVar7 = local_130->m_p;
    uVar30 = 0;
    puVar19 = puVar4;
    do {
      pbVar6[uVar30] = SUB41(puVar4[uVar30 * 0x41 + 0x40],0);
      puVar7[uVar30] = 0;
      lVar29 = 0;
      uVar15 = 0;
      puVar22 = puVar19;
      do {
        if (puVar22[(ulong)(puVar22[2] < puVar22[1]) + 1] <
            *(uint *)((long)puVar22 + (ulong)((uint)(puVar22[3] < *puVar22) * 0xc))) {
          uVar13 = (uint)(byte)((puVar22[2] < puVar22[1]) + 1);
        }
        else {
          uVar13 = (uint)(puVar22[3] < *puVar22) * 3;
        }
        uVar15 = uVar15 | uVar13 << ((byte)lVar29 & 0x1f);
        puVar7[uVar30] = uVar15;
        puVar22 = puVar22 + 4;
        lVar29 = lVar29 + 2;
      } while (lVar29 != 0x20);
      uVar30 = uVar30 + 1;
      puVar19 = puVar19 + 0x41;
    } while (uVar30 < (this->m_color_selectors).m_size);
  }
  if ((uint64 *)local_188._0_8_ != (uint64 *)0x0) {
    uVar30 = (ulong)(uint)local_188._8_4_;
    if (uVar30 != 0) {
      lVar29 = 0;
      do {
        if (*(void **)(uVar8 + lVar29) != (void *)0x0) {
          crnlib_free(*(void **)(uVar8 + lVar29));
        }
        lVar29 = lVar29 + 0x10;
      } while (uVar30 << 4 != lVar29);
    }
    crnlib_free((void *)local_188._0_8_);
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_d8);
  if (local_178.m_p != (uint *)0x0) {
    crnlib_free(local_178.m_p);
  }
  if (local_158.m_p != (vec<16U,_float> *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_);
  }
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_148.m_p != (void *)0x0) {
    crnlib_free(local_148.m_p);
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<uint64> selectors(m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks);
        for (uint i = 0, b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
        {
            selectors[i++] = m_block_selectors[cColor][b] + (m_has_subblocks ? m_block_selectors[cColor][b + 1] : 0);
        }

        crnlib::vector<SelectorNode> nodes;
        SelectorNode node(0, selectors.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<SelectorNode> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        float v[4];
        for (uint s = 0; s < 4; s++)
        {
            v[s] = (s + 0.5f) * 0.25f;
        }

        crnlib::vector<vec16F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(selectors.size());
        weights.reserve(selectors.size());
        for (uint64 prev_selector = 0; queue.size();)
        {
            SelectorNode node = queue.top();
            uint64 selector = *node.p++;
            queue.pop();
            if (node.p != node.pEnd)
            {
                queue.push(node);
            }
            uint weight = (uint)selector;
            selector >>= 32;
            if (!vectors.size() || selector != prev_selector)
            {
                prev_selector = selector;
                vec16F vector;
                for (uint p = 0; p < 16; p++, selector >>= 2)
                {
                    vector[15 - p] = v[selector & 3];
                }
                vectors.push_back(vector);
                weights.push_back(weight);
            }
            else if (weights.back() > UINT_MAX - weight)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += weight;
            }
        }

        tree_clusterizer<vec16F> selector_vq;
        selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_color_selector_codebook_size, false, m_pTask_pool);
        m_color_selectors.resize(selector_vq.get_codebook_size());
        m_color_selectors_used.resize(selector_vq.get_codebook_size());
        for (uint i = 0; i < selector_vq.get_codebook_size(); i++)
        {
            const vec16F& v = selector_vq.get_codebook_entry(i);
            m_color_selectors[i] = 0;
            for (uint sh = 0, j = 0; j < 16; j++, sh += 2)
            {
                m_color_selectors[i] |= (uint)(v[j] * 4.0f) << sh;
            }
        }

        crnlib::vector<crnlib::vector<color_selector_details>> selector_details(num_tasks);
        for (uint t = 0; t < num_tasks; t++)
        {
            selector_details[t].resize(m_color_selectors.size());
            m_pTask_pool->queue_object_task(this, &dxt_hc::create_color_selector_codebook_task, t, &selector_details[t]);
        }
        m_pTask_pool->join();

        for (uint t = 1; t < num_tasks; t++)
        {
            for (uint i = 0; i < m_color_selectors.size(); i++)
            {
                for (uint8 p = 0; p < 16; p++)
                {
                    for (uint8 s = 0; s < 4; s++)
                    {
                        selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
                    }
                }
                selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
            }
        }

        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            m_color_selectors_used[i] = selector_details[0][i].used;
            uint(&errors)[16][4] = selector_details[0][i].error;
            m_color_selectors[i] = 0;
            for (uint sh = 0, p = 0; p < 16; p++, sh += 2)
            {
                uint* e = errors[p];
                uint8 s03 = e[3] < e[0] ? 3 : 0;
                uint8 s12 = e[2] < e[1] ? 2 : 1;
                m_color_selectors[i] |= (e[s12] < e[s03] ? s12 : s03) << sh;
            }
        }
    }